

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

void memoryIo_destroy(PHYSFS_Io *io)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  code *pcVar4;
  void *buf;
  _func_void_void_ptr *destruct;
  PHYSFS_Io *parent;
  MemoryIoInfo *info;
  PHYSFS_Io *io_local;
  
  plVar2 = (long *)io->opaque;
  lVar3 = plVar2[3];
  if (lVar3 == 0) {
    if ((int)plVar2[4] < 1) {
      __assert_fail("info->refcount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                    ,0x163,"void memoryIo_destroy(PHYSFS_Io *)");
    }
    LOCK();
    plVar1 = plVar2 + 4;
    lVar3 = *plVar1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)lVar3 == 0) {
      pcVar4 = (code *)plVar2[5];
      lVar3 = *plVar2;
      io->opaque = (void *)0x0;
      (*__PHYSFS_AllocatorHooks.Free)(plVar2);
      (*__PHYSFS_AllocatorHooks.Free)(io);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(lVar3);
      }
    }
  }
  else {
    if (*plVar2 != **(long **)(plVar2[3] + 8)) {
      __assert_fail("info->buf == ((MemoryIoInfo *) info->parent->opaque)->buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                    ,0x158,"void memoryIo_destroy(PHYSFS_Io *)");
    }
    if (plVar2[1] != *(long *)(*(long *)(plVar2[3] + 8) + 8)) {
      __assert_fail("info->len == ((MemoryIoInfo *) info->parent->opaque)->len",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                    ,0x159,"void memoryIo_destroy(PHYSFS_Io *)");
    }
    if ((int)plVar2[4] != 0) {
      __assert_fail("info->refcount == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                    ,0x15a,"void memoryIo_destroy(PHYSFS_Io *)");
    }
    if (plVar2[5] != 0) {
      __assert_fail("info->destruct == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                    ,0x15b,"void memoryIo_destroy(PHYSFS_Io *)");
    }
    (*__PHYSFS_AllocatorHooks.Free)(plVar2);
    (*__PHYSFS_AllocatorHooks.Free)(io);
    (**(code **)(lVar3 + 0x48))(lVar3);
  }
  return;
}

Assistant:

static void memoryIo_destroy(PHYSFS_Io *io)
{
    MemoryIoInfo *info = (MemoryIoInfo *) io->opaque;
    PHYSFS_Io *parent = info->parent;

    if (parent != NULL)
    {
        assert(info->buf == ((MemoryIoInfo *) info->parent->opaque)->buf);
        assert(info->len == ((MemoryIoInfo *) info->parent->opaque)->len);
        assert(info->refcount == 0);
        assert(info->destruct == NULL);
        allocator.Free(info);
        allocator.Free(io);
        parent->destroy(parent);  /* decrements refcount. */
        return;
    } /* if */

    /* we _are_ the parent. */
    assert(info->refcount > 0);  /* even in a race, we hold a reference. */

    if (__PHYSFS_ATOMIC_DECR(&info->refcount) == 0)
    {
        void (*destruct)(void *) = info->destruct;
        void *buf = (void *) info->buf;
        io->opaque = NULL;  /* kill this here in case of race. */
        allocator.Free(info);
        allocator.Free(io);
        if (destruct != NULL)
            destruct(buf);
    } /* if */
}